

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void down_box_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  Fl_Widget *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar7;
  long lVar8;
  void **ppvVar9;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  char cVar10;
  Fl_Widget_Type **ppFVar11;
  void *pvVar12;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x18])();
    if ((iVar3 == 0) ||
       (iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar3 != 0)) {
      iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"Fl_Input_Choice");
      if (iVar3 == 0) {
        ppFVar11 = (Fl_Widget_Type **)&current_widget->o;
        lVar6 = 0x89;
        lVar8 = 0xa8;
      }
      else {
        iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1f])();
        if (iVar3 == 0) {
          Fl_Widget::deactivate((Fl_Widget *)i);
          return;
        }
        lVar6 = 0x89;
        lVar8 = 0xd0;
        ppFVar11 = &current_widget;
      }
    }
    else {
      ppFVar11 = &current_widget;
      lVar6 = 0x7e;
      lVar8 = 0xd0;
    }
    pvVar12 = (void *)(ulong)*(byte *)(*(long *)((long)&((Fl_Widget *)*ppFVar11)->_vptr_Fl_Widget +
                                                lVar8) + lVar6);
    Fl_Widget::activate((Fl_Widget *)i);
    pvVar7 = (void *)0x3e8;
    if (pvVar12 != (void *)0x0) {
      pvVar7 = pvVar12;
    }
    ppvVar9 = &boxmenu[0].user_data_;
    lVar6 = 0;
    do {
      if (pvVar7 == *ppvVar9) {
        Fl_Choice::value(i,(int)lVar6);
        return;
      }
      lVar6 = lVar6 + 1;
      ppvVar9 = ppvVar9 + 7;
    } while (lVar6 != 0x3d);
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      lVar6 = -1;
    }
    else {
      lVar6 = (long)((int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249);
    }
    iVar3 = *(int *)&boxmenu[lVar6].user_data_;
    if ((iVar3 != 0) && (Fl_Type::first != (Fl_Type *)0x0)) {
      iVar4 = 0;
      this = (Fl_Widget_Type *)Fl_Type::first;
      if (iVar3 == 1000) {
        iVar3 = iVar4;
      }
      do {
        if ((this->super_Fl_Type).selected != '\0') {
          iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
          cVar10 = (char)iVar3;
          if ((iVar4 == 0) ||
             (iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this), iVar4 != 0)) {
            iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
            iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"Fl_Input_Choice");
            if (iVar4 == 0) {
              this->o[1].label_.value[0x89] = cVar10;
              iVar4 = 1;
            }
            else {
              iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])(this);
              iVar4 = 1;
              if (iVar5 != 0) {
                *(char *)((long)&this->o[1].callback_ + 1) = cVar10;
              }
            }
          }
          else {
            pFVar2 = this->o;
            *(char *)((long)&pFVar2[1]._vptr_Fl_Widget + 6) = cVar10;
            iVar4 = 1;
            if (*(char *)((long)&pFVar2[1]._vptr_Fl_Widget + 4) != '\0') {
              Fl_Widget_Type::redraw(this);
            }
          }
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (iVar4 != 0) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void down_box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n;
    if (current_widget->is_button() && !current_widget->is_menu_item())
      n = ((Fl_Button*)(current_widget->o))->down_box();
    else if (!strcmp(current_widget->type_name(), "Fl_Input_Choice"))
      n = ((Fl_Input_Choice*)(current_widget->o))->down_box();
    else if (current_widget->is_menu_button())
      n = ((Fl_Menu_*)(current_widget->o))->down_box();
    else {
      i->deactivate(); return;
    }
    i->activate();
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected) {
	if (o->is_button() && !o->is_menu_item()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Button*)(q->o))->down_box((Fl_Boxtype)n);
          if (((Fl_Button*)(q->o))->value()) q->redraw();
	} else if (!strcmp(o->type_name(), "Fl_Input_Choice")) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	  ((Fl_Input_Choice*)(q->o))->down_box((Fl_Boxtype)n);
	} else if (o->is_menu_button()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Menu_*)(q->o))->down_box((Fl_Boxtype)n);
	}
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}